

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_sum_intra_stats(AV1_COMMON *cm,FRAME_COUNTS *counts,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,
                        MB_MODE_INFO *above_mi,MB_MODE_INFO *left_mi,int intraonly)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  char val;
  uint8_t uVar3;
  FRAME_CONTEXT *pFVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  aom_cdf_prob (*cdf) [14];
  int iVar10;
  
  pFVar4 = xd->tile_ctx;
  bVar1 = mbmi->mode;
  BVar2 = mbmi->bsize;
  if (intraonly == 0) {
    cdf = pFVar4->y_mode_cdf + ""[BVar2];
  }
  else {
    bVar5 = av1_above_block_mode(above_mi);
    bVar6 = av1_left_block_mode(left_mi);
    cdf = pFVar4->kf_y_cdf[intra_mode_context[bVar5]] + intra_mode_context[bVar6];
  }
  update_cdf(*cdf,bVar1,0xd);
  if (((((mbmi->mode == '\0') && ((mbmi->palette_mode_info).palette_size[0] == '\0')) &&
       (uVar9 = (ulong)mbmi->bsize, uVar9 != 0xff)) &&
      ((cm->seq_params->enable_filter_intra != '\0' && ((0x1f07ffUL >> (uVar9 & 0x3f) & 1) != 0))))
     && ((0x2f0bffUL >> (uVar9 & 0x3f) & 1) != 0)) {
    uVar3 = (mbmi->filter_intra_mode_info).use_filter_intra;
    update_cdf(pFVar4->filter_intra_cdfs[uVar9],uVar3,2);
    if (uVar3 != '\0') {
      update_cdf(pFVar4->filter_intra_mode_cdf,(mbmi->filter_intra_mode_info).filter_intra_mode,5);
    }
  }
  if (BLOCK_8X4 < BVar2 && 0xf7 < (byte)(mbmi->mode - 9)) {
    update_cdf(pFVar4->angle_delta_cdf[(ulong)mbmi->mode - 1],mbmi->angle_delta[0] + '\x03',7);
  }
  if (xd->is_chroma_ref == true) {
    bVar5 = mbmi->uv_mode;
    bVar6 = is_cfl_allowed(xd);
    update_cdf(pFVar4->uv_mode_cdf[bVar6][bVar1],bVar5,(uint)(byte)((bVar6 ^ 0xfe) + 0xf));
    if (bVar5 == 0xd) {
      val = mbmi->cfl_alpha_signs;
      bVar1 = mbmi->cfl_alpha_idx;
      update_cdf(pFVar4->cfl_sign_cdf,val,8);
      iVar8 = val + 1;
      uVar7 = iVar8 * 0xb;
      iVar10 = (int)uVar7 >> 5;
      if (0x1f < uVar7) {
        update_cdf(pFVar4->cfl_sign_cdf + (long)(int)val * 0x11 + -0x19,bVar1 >> 4,0x10);
      }
      iVar8 = iVar10 * -3 + iVar8;
      if (iVar8 != 0) {
        update_cdf(pFVar4->cfl_alpha_cdf[iVar8 * 3 + iVar10 + -3],bVar1 & 0xf,0x10);
      }
    }
    if (0xf7 < (byte)(get_uv_mode_uv2y[bVar5] - 9) && BLOCK_8X4 < BVar2) {
      update_cdf(pFVar4->angle_delta_cdf[(ulong)(byte)get_uv_mode_uv2y[bVar5] - 1],
                 mbmi->angle_delta[1] + '\x03',7);
    }
    if (((cm->features).allow_screen_content_tools != false) &&
       ((BLOCK_128X128 < BVar2 || ((0xe007U >> (BVar2 & 0x1f) & 1) == 0)))) {
      pFVar4 = xd->tile_ctx;
      bVar1 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[mbmi->bsize];
      if (mbmi->mode == '\0') {
        uVar7 = 0;
        if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
          uVar7 = (uint)((xd->above_mbmi->palette_mode_info).palette_size[0] != '\0');
        }
        uVar3 = (mbmi->palette_mode_info).palette_size[0];
        if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
          uVar7 = (uVar7 + 1) - (uint)((xd->left_mbmi->palette_mode_info).palette_size[0] == '\0');
        }
        update_cdf(pFVar4->palette_y_mode_cdf[(ulong)bVar1 - 6][uVar7],uVar3 != '\0',2);
        if (uVar3 != '\0') {
          update_cdf(pFVar4->palette_y_size_cdf[(ulong)bVar1 - 6],uVar3 + 0xfe,7);
        }
      }
      if (mbmi->uv_mode == '\0') {
        uVar3 = (mbmi->palette_mode_info).palette_size[1];
        update_cdf(pFVar4->palette_uv_mode_cdf[(mbmi->palette_mode_info).palette_size[0] != '\0'],
                   uVar3 != '\0',2);
        if (uVar3 != '\0') {
          update_cdf(pFVar4->palette_uv_size_cdf[(int)(bVar1 - 6)],uVar3 + 0xfe,7);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_sum_intra_stats(const AV1_COMMON *const cm, FRAME_COUNTS *counts,
                         MACROBLOCKD *xd, const MB_MODE_INFO *const mbmi,
                         const MB_MODE_INFO *above_mi,
                         const MB_MODE_INFO *left_mi, const int intraonly) {
  FRAME_CONTEXT *fc = xd->tile_ctx;
  const PREDICTION_MODE y_mode = mbmi->mode;
  (void)counts;
  const BLOCK_SIZE bsize = mbmi->bsize;

  if (intraonly) {
#if CONFIG_ENTROPY_STATS
    const PREDICTION_MODE above = av1_above_block_mode(above_mi);
    const PREDICTION_MODE left = av1_left_block_mode(left_mi);
    const int above_ctx = intra_mode_context[above];
    const int left_ctx = intra_mode_context[left];
    ++counts->kf_y_mode[above_ctx][left_ctx][y_mode];
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(get_y_mode_cdf(fc, above_mi, left_mi), y_mode, INTRA_MODES);
  } else {
#if CONFIG_ENTROPY_STATS
    ++counts->y_mode[size_group_lookup[bsize]][y_mode];
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(fc->y_mode_cdf[size_group_lookup[bsize]], y_mode, INTRA_MODES);
  }

  if (av1_filter_intra_allowed(cm, mbmi)) {
    const int use_filter_intra_mode =
        mbmi->filter_intra_mode_info.use_filter_intra;
#if CONFIG_ENTROPY_STATS
    ++counts->filter_intra[mbmi->bsize][use_filter_intra_mode];
    if (use_filter_intra_mode) {
      ++counts
            ->filter_intra_mode[mbmi->filter_intra_mode_info.filter_intra_mode];
    }
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(fc->filter_intra_cdfs[mbmi->bsize], use_filter_intra_mode, 2);
    if (use_filter_intra_mode) {
      update_cdf(fc->filter_intra_mode_cdf,
                 mbmi->filter_intra_mode_info.filter_intra_mode,
                 FILTER_INTRA_MODES);
    }
  }
  if (av1_is_directional_mode(mbmi->mode) && av1_use_angle_delta(bsize)) {
#if CONFIG_ENTROPY_STATS
    ++counts->angle_delta[mbmi->mode - V_PRED]
                         [mbmi->angle_delta[PLANE_TYPE_Y] + MAX_ANGLE_DELTA];
#endif
    update_cdf(fc->angle_delta_cdf[mbmi->mode - V_PRED],
               mbmi->angle_delta[PLANE_TYPE_Y] + MAX_ANGLE_DELTA,
               2 * MAX_ANGLE_DELTA + 1);
  }

  if (!xd->is_chroma_ref) return;

  const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
  const CFL_ALLOWED_TYPE cfl_allowed = is_cfl_allowed(xd);
#if CONFIG_ENTROPY_STATS
  ++counts->uv_mode[cfl_allowed][y_mode][uv_mode];
#endif  // CONFIG_ENTROPY_STATS
  update_cdf(fc->uv_mode_cdf[cfl_allowed][y_mode], uv_mode,
             UV_INTRA_MODES - !cfl_allowed);
  if (uv_mode == UV_CFL_PRED) {
    const int8_t joint_sign = mbmi->cfl_alpha_signs;
    const uint8_t idx = mbmi->cfl_alpha_idx;

#if CONFIG_ENTROPY_STATS
    ++counts->cfl_sign[joint_sign];
#endif
    update_cdf(fc->cfl_sign_cdf, joint_sign, CFL_JOINT_SIGNS);
    if (CFL_SIGN_U(joint_sign) != CFL_SIGN_ZERO) {
      aom_cdf_prob *cdf_u = fc->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];

#if CONFIG_ENTROPY_STATS
      ++counts->cfl_alpha[CFL_CONTEXT_U(joint_sign)][CFL_IDX_U(idx)];
#endif
      update_cdf(cdf_u, CFL_IDX_U(idx), CFL_ALPHABET_SIZE);
    }
    if (CFL_SIGN_V(joint_sign) != CFL_SIGN_ZERO) {
      aom_cdf_prob *cdf_v = fc->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];

#if CONFIG_ENTROPY_STATS
      ++counts->cfl_alpha[CFL_CONTEXT_V(joint_sign)][CFL_IDX_V(idx)];
#endif
      update_cdf(cdf_v, CFL_IDX_V(idx), CFL_ALPHABET_SIZE);
    }
  }
  const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
  if (av1_is_directional_mode(intra_mode) && av1_use_angle_delta(bsize)) {
#if CONFIG_ENTROPY_STATS
    ++counts->angle_delta[intra_mode - V_PRED]
                         [mbmi->angle_delta[PLANE_TYPE_UV] + MAX_ANGLE_DELTA];
#endif
    update_cdf(fc->angle_delta_cdf[intra_mode - V_PRED],
               mbmi->angle_delta[PLANE_TYPE_UV] + MAX_ANGLE_DELTA,
               2 * MAX_ANGLE_DELTA + 1);
  }
  if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
    update_palette_cdf(xd, mbmi, counts);
  }
}